

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  bool bVar1;
  int iVar2;
  MapFieldBase *this;
  RepeatedPtrFieldBase *this_00;
  MessageFactory *pMVar3;
  undefined4 extraout_var;
  Descriptor *pDVar4;
  int i;
  int iVar5;
  MapIterator iter;
  Message *map_entry_message;
  MapIterator local_c0;
  MapIterator local_78;
  
  this = Reflection::GetMapData(reflection,message,field);
  bVar1 = MapFieldBase::IsRepeatedFieldValid(this);
  if (bVar1) {
    this_00 = &Reflection::GetRepeatedPtrFieldInternal<google::protobuf::Message>
                         (reflection,message,field)->super_RepeatedPtrFieldBase;
    for (iVar5 = 0; iVar5 < this_00->current_size_; iVar5 = iVar5 + 1) {
      local_c0.iter_ =
           RepeatedPtrFieldBase::
           Mutable<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                     (this_00,iVar5);
      std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
      ::emplace_back<google::protobuf::Message_const*>
                ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                  *)sorted_map_field,(Message **)&local_c0);
    }
  }
  else {
    pDVar4 = FieldDescriptor::message_type(field);
    pMVar3 = Reflection::GetMessageFactory(reflection);
    iVar5 = (*pMVar3->_vptr_MessageFactory[2])(pMVar3,pDVar4);
    Reflection::MapBegin(&local_c0,reflection,message,field);
    while( true ) {
      Reflection::MapEnd(&local_78,reflection,message,field);
      iVar2 = (*(local_c0.map_)->_vptr_MapFieldBase[6])(local_c0.map_,&local_c0,&local_78);
      MapIterator::~MapIterator(&local_78);
      if ((char)iVar2 != '\0') break;
      local_78.iter_ =
           (void *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x18))
                             ((long *)CONCAT44(extraout_var,iVar5),0);
      CopyKey(&local_c0.key_,(Message *)local_78.iter_,*(FieldDescriptor **)(pDVar4 + 0x28));
      CopyValue(&local_c0.value_,(Message *)local_78.iter_,
                (FieldDescriptor *)(*(long *)(pDVar4 + 0x28) + 0x48));
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::push_back(sorted_map_field,(value_type *)&local_78);
      (*(local_c0.map_)->_vptr_MapFieldBase[0x14])(local_c0.map_,&local_c0);
    }
    MapIterator::~MapIterator(&local_c0);
  }
  pDVar4 = FieldDescriptor::message_type(field);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
            ((__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
              )(sorted_map_field->
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
              )(sorted_map_field->
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
             (MapEntryMessageComparator)*(MapEntryMessageComparator *)(pDVar4 + 0x28));
  return !bVar1;
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrFieldInternal<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO(teboring): For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype =
        reflection->GetMessageFactory()->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}